

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall argo::json::reset(json *this)

{
  type tVar1;
  json *this_local;
  
  tVar1 = this->m_type;
  if (tVar1 == object_e) {
    destroy_object(this);
  }
  else if (tVar1 == array_e) {
    destroy_array(this);
  }
  else if (tVar1 == string_e) {
    destroy_string(this);
  }
  this->m_type = null_e;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void json::reset()
{
    switch (m_type)
    {
    case object_e:
        destroy_object();
        break;
    case array_e:
        destroy_array();
        break;
    case string_e:
        destroy_string();
        break;
    default:
        break;
    }

    m_type = null_e;
    m_raw_value.clear();
}